

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

object * __thiscall
jessilib::json_parser::deserialize_bytes
          (object *__return_storage_ptr__,json_parser *this,bytes_view_type in_data,
          text_encoding in_write_encoding)

{
  ushort *puVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  _Uninitialized<void_*,_true> inout_read_view;
  long lVar5;
  ulong uVar6;
  string_view in_mbstring;
  u8string_view data_view;
  u32string_view data_view_1;
  undefined1 local_50 [40];
  undefined8 local_28;
  undefined8 local_20;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *inout_read_view_00;
  
  in_mbstring._M_str = in_data._M_str;
  inout_read_view._M_storage = (void *)in_data._M_len;
  *(undefined8 *)
   &(__return_storage_ptr__->m_value).
    super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    .
    super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    .
    super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    .
    super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    .
    super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    .
    super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
       = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->m_value).
           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
           .
           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
   + 0x30) = '\0';
  switch(in_write_encoding) {
  case utf_8:
    local_50._0_8_ = inout_read_view._M_storage;
    local_50._8_8_ = in_mbstring._M_str;
    deserialize_json<char8_t,_true,_&jessilib::fail_action>
              ((jessilib *)__return_storage_ptr__,(object *)local_50,
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)inout_read_view._M_storage)
    ;
    break;
  case utf_16:
    local_50._8_8_ = in_mbstring._M_str;
    local_50._0_8_ = (char *)((ulong)inout_read_view._M_storage >> 1);
    if (((undefined1  [16])in_data & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_50._8_8_ = (char *)0x0;
      local_50._0_8_ = (char *)0x0;
    }
    deserialize_json<char16_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)local_50);
    break;
  case utf_16_big:
    pcVar4 = in_mbstring._M_str;
    pcVar3 = (char *)((ulong)inout_read_view._M_storage >> 1);
    if (((undefined1  [16])in_data & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar4 = (char *)0x0;
      pcVar3 = (char *)0x0;
    }
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::u16string::_M_construct<char16_t_const*>
              ((u16string *)local_50,pcVar4,pcVar4 + (long)pcVar3 * 2);
    if ((undefined1 *)local_50._8_8_ != (undefined1 *)0x0) {
      lVar5 = 0;
      do {
        puVar1 = (ushort *)(local_50._0_8_ + lVar5);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        lVar5 = lVar5 + 2;
      } while (local_50._8_8_ * 2 != lVar5);
    }
    local_28 = local_50._8_8_;
    local_20 = local_50._0_8_;
    deserialize_json<char16_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&stack0xffffffffffffffd8)
    ;
    if ((undefined1 *)local_50._0_8_ == local_50 + 0x10) {
      return __return_storage_ptr__;
    }
    uVar6 = local_50._16_8_ * 2 + 2;
    local_50._8_8_ = local_50._0_8_;
    goto LAB_0015c3f5;
  case utf_32:
    local_50._8_8_ = in_mbstring._M_str;
    local_50._0_8_ = (char *)((ulong)inout_read_view._M_storage >> 2);
    if (((undefined1  [16])in_data & (undefined1  [16])0x3) != (undefined1  [16])0x0) {
      local_50._8_8_ = (char *)0x0;
      local_50._0_8_ = (char *)0x0;
    }
    deserialize_json<char32_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)local_50);
    break;
  case utf_32_big:
    pcVar4 = in_mbstring._M_str;
    pcVar3 = (char *)((ulong)inout_read_view._M_storage >> 2);
    if (((undefined1  [16])in_data & (undefined1  [16])0x3) != (undefined1  [16])0x0) {
      pcVar4 = (char *)0x0;
      pcVar3 = (char *)0x0;
    }
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)local_50,pcVar4,pcVar4 + (long)pcVar3 * 4);
    if ((undefined1 *)local_50._8_8_ != (undefined1 *)0x0) {
      lVar5 = 0;
      do {
        uVar2 = *(uint *)(local_50._0_8_ + lVar5);
        *(uint *)(local_50._0_8_ + lVar5) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        lVar5 = lVar5 + 4;
      } while (local_50._8_8_ * 4 - lVar5 != 0);
    }
    local_28 = local_50._8_8_;
    local_20 = local_50._0_8_;
    deserialize_json<char32_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)&stack0xffffffffffffffd8)
    ;
    if ((undefined1 *)local_50._0_8_ == local_50 + 0x10) {
      return __return_storage_ptr__;
    }
    uVar6 = local_50._16_8_ * 4 + 4;
    local_50._8_8_ = local_50._0_8_;
    goto LAB_0015c3f5;
  case wchar:
    local_50._8_8_ = in_mbstring._M_str;
    local_50._0_8_ = (char *)((ulong)inout_read_view._M_storage >> 2);
    if (((undefined1  [16])in_data & (undefined1  [16])0x3) != (undefined1  [16])0x0) {
      local_50._8_8_ = (char *)0x0;
      local_50._0_8_ = (char *)0x0;
    }
    deserialize_json<wchar_t,_true,_&jessilib::fail_action>
              (__return_storage_ptr__,
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_50);
    break;
  case multibyte:
    in_mbstring._M_len = (size_t)in_mbstring._M_str;
    mbstring_to_ustring<char8_t>
              ((pair<bool,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                *)local_50,(jessilib *)inout_read_view._M_storage,in_mbstring);
    local_28 = local_50._16_8_;
    local_20 = local_50._8_8_;
    deserialize_json<char8_t,_true,_&jessilib::fail_action>
              ((jessilib *)__return_storage_ptr__,(object *)&stack0xffffffffffffffd8,
               inout_read_view_00);
    if ((undefined1 *)local_50._8_8_ == local_50 + 0x18) {
      return __return_storage_ptr__;
    }
    uVar6 = local_50._24_8_ + 1;
LAB_0015c3f5:
    operator_delete((void *)local_50._8_8_,uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

object json_parser::deserialize_bytes(bytes_view_type in_data, text_encoding in_write_encoding) {
	object result;

	if (in_write_encoding == text_encoding::utf_8) {
		std::u8string_view data_view = jessilib::string_view_cast<char8_t>(in_data);
		deserialize_json<char8_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::utf_16) {
		std::u16string_view data_view = jessilib::string_view_cast<char16_t>(in_data);
		deserialize_json<char16_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::utf_32) {
		std::u32string_view data_view = jessilib::string_view_cast<char32_t>(in_data);
		deserialize_json<char32_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::wchar) {
		std::wstring_view data_view = jessilib::string_view_cast<wchar_t>(in_data);
		deserialize_json<wchar_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::multibyte) {
		// TODO: support without copying
		auto u8_data = mbstring_to_ustring<char8_t>(jessilib::string_view_cast<char>(in_data));
		std::u8string_view data_view = u8_data.second;
		deserialize_json<char8_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::utf_16_foreign) {
		// TODO: support without copying
		std::u16string u16_data{ jessilib::string_view_cast<char16_t>(in_data) };
		array_byteswap(u16_data.data(), u16_data.data() + u16_data.size());
		std::u16string_view data_view = u16_data;

		deserialize_json<char16_t, true>(result, data_view);
	}
	else if (in_write_encoding == text_encoding::utf_32_foreign) {
		// TODO: support without copying
		std::u32string u32_data{ jessilib::string_view_cast<char32_t>(in_data) };
		array_byteswap(u32_data.data(), u32_data.data() + u32_data.size());
		std::u32string_view data_view = u32_data;

		deserialize_json<char32_t, true>(result, data_view);
	}

	return result;
}